

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSystem.cpp
# Opt level: O2

void __thiscall iDynTree::optimalcontrol::LinearSystem::~LinearSystem(LinearSystem *this)

{
  LinearSystemPimpl *this_00;
  
  (this->super_DynamicalSystem)._vptr_DynamicalSystem = (_func_int **)&PTR__LinearSystem_001d3808;
  this_00 = this->m_pimpl;
  if (this_00 != (LinearSystemPimpl *)0x0) {
    LinearSystemPimpl::~LinearSystemPimpl(this_00);
    operator_delete(this_00,0xf8);
    this->m_pimpl = (LinearSystemPimpl *)0x0;
  }
  DynamicalSystem::~DynamicalSystem(&this->super_DynamicalSystem);
  return;
}

Assistant:

LinearSystem::~LinearSystem()
        {
            if(m_pimpl){
                delete m_pimpl;
                m_pimpl = nullptr;
            }
        }